

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::anon_unknown_0::FillTest::testRender(FillTest *this)

{
  int iVar1;
  TextureFormat log;
  FillTest *pFVar2;
  int iVar3;
  RenderTarget *pRVar4;
  RenderTarget *pRVar5;
  int i;
  long lVar6;
  ulong uVar7;
  LogImageSet *access;
  ConstPixelBufferAccess *pCVar8;
  ulong uVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int iVar10;
  int iVar11;
  int iVar12;
  ChannelOrder __fd;
  undefined8 uVar13;
  void *pvVar14;
  Surface refSurface;
  Surface testSurface;
  Surface outputImage;
  Surface diffMask;
  IVec4 cTest;
  Vector<bool,_4> res_1;
  IVec4 cSrc;
  Vector<int,_4> res;
  IVec4 threshold;
  IVec4 halfFilled;
  ReferenceContextLimits limits;
  ReferenceContextBuffers buffers;
  GLContext glesContext;
  ReferenceContext refContext;
  Surface local_6970;
  Surface local_6958;
  string local_6940;
  RenderTarget *local_6920;
  string local_6918;
  string local_68f8;
  string local_68d8;
  string local_68b8;
  int local_6894;
  Surface local_6890;
  undefined1 local_6878 [40];
  FillTest *local_6850;
  string local_6848;
  undefined1 local_6828 [40];
  TextureFormat local_6800;
  LogImage local_67f8;
  string local_6768;
  string local_6748;
  LogImageSet local_6728;
  LogImage local_66e8;
  LogImage local_6658;
  ConstPixelBufferAccess local_65c8;
  undefined1 local_65a0 [8];
  undefined8 uStack_6598;
  ios_base local_6528 [264];
  ReferenceContextLimits local_6420;
  ReferenceContextBuffers local_63c8;
  GLContext local_6350;
  ReferenceContext local_61e0;
  
  log = (TextureFormat)
        ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_61e0.super_Context._vptr_Context = (_func_int **)0x0;
  local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  local_61e0.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&local_6350,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             (TestLog *)log,0,(IVec4 *)&local_61e0);
  local_6420.extensionStr._M_dataplus._M_p = (pointer)&local_6420.extensionStr.field_2;
  local_6420.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_6420.maxTextureImageUnits = 0x10;
  local_6420.maxTexture2DSize = 0x800;
  local_6420.maxTextureCubeSize = 0x800;
  local_6420.maxTexture2DArrayLayers = 0x100;
  local_6420.maxTexture3DSize = 0x100;
  local_6420.maxRenderbufferSize = 0x800;
  local_6420.maxVertexAttribs = 0x10;
  local_6420.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6420.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6420.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6420.extensionStr._M_string_length = 0;
  local_6420.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar4 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar5 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_63c8,&pRVar4->m_pixelFormat,pRVar5->m_depthBits,0,200,200,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_65a0,&local_63c8.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_65a0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_65a0,&local_63c8.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_65a0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_65a0,&local_63c8.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_65a0);
  sglr::ReferenceContext::ReferenceContext
            (&local_61e0,&local_6420,(MultisamplePixelBufferAccess *)&local_66e8,
             (MultisamplePixelBufferAccess *)&local_67f8,(MultisamplePixelBufferAccess *)&local_6658
            );
  tcu::Surface::Surface(&local_6958,200,200);
  tcu::Surface::Surface(&local_6970,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_6350);
  sglr::Context::readPixels(&local_6350.super_Context,&local_6958,0,0,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_61e0);
  sglr::Context::readPixels(&local_61e0.super_Context,&local_6970,0,0,200,200);
  tcu::Surface::Surface((Surface *)&local_6940,200,200);
  local_65a0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_6598);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_6598,"Checking for overdraw ",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_65a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_6598);
  std::ios_base::~ios_base(local_6528);
  local_6920 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  local_65a0._0_4_ = RGBA;
  local_65a0._4_4_ = UNORM_INT8;
  pvVar14 = (void *)local_6958.m_pixels.m_cap;
  if ((void *)local_6958.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_6958.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_66e8,(TextureFormat *)local_65a0,local_6958.m_width,
             local_6958.m_height,1,pvVar14);
  local_65a0._0_4_ = RGBA;
  local_65a0._4_4_ = UNORM_INT8;
  uVar13 = local_6940.field_2._M_allocated_capacity;
  if ((void *)local_6940.field_2._M_allocated_capacity != (void *)0x0) {
    uVar13 = local_6940._M_string_length;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_67f8,(TextureFormat *)local_65a0,
             (int)local_6940._M_dataplus._M_p,local_6940._M_dataplus._M_p._4_4_,1,(void *)uVar13);
  tcu::clear((PixelBufferAccess *)&local_67f8,
             (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_OK);
  iVar11 = 0;
  local_6850 = this;
  iVar3 = iVar11;
  if (0 < local_66e8.m_name._M_string_length._4_4_) {
    local_6894 = local_66e8.m_name._M_string_length._4_4_;
    iVar3 = 0;
    do {
      if (0 < (int)local_66e8.m_name._M_string_length) {
        iVar10 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_6878,(int)&local_66e8,iVar10,iVar11);
          if (((local_6878._0_4_ != R) || (local_6878._4_4_ != SNORM_INT8)) ||
             (local_6878._8_4_ != 0)) {
            local_65a0._0_4_ = 0x7f;
            local_65a0._4_4_ = SNORM_INT8;
            uStack_6598 = (_func_int **)0x0;
            local_6658.m_name._M_dataplus._M_p = (char *)0x10000000014;
            local_6658.m_name._M_string_length = 0x10000000100;
            local_65c8.m_format.order = R;
            local_65c8.m_format.type = SNORM_INT8;
            local_65c8.m_size.m_data[0] = 0;
            local_65c8.m_size.m_data[1] = 0;
            lVar6 = 0;
            do {
              local_65c8.m_size.m_data[lVar6 + -2] =
                   *(int *)(local_6878 + lVar6 * 4) - *(int *)(local_65a0 + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            local_6728.m_name._M_dataplus._M_p = (char *)0x0;
            local_6728.m_name._M_string_length = 0;
            lVar6 = 0;
            do {
              iVar1 = local_65c8.m_size.m_data[lVar6 + -2];
              iVar12 = -iVar1;
              if (0 < iVar1) {
                iVar12 = iVar1;
              }
              *(int *)((long)&local_6728.m_name._M_dataplus._M_p + lVar6 * 4) = iVar12;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            local_6828._0_8_ = local_6828._0_8_ & 0xffffffff00000000;
            lVar6 = 0;
            do {
              local_6828[lVar6] =
                   *(int *)((long)&local_6728.m_name._M_dataplus._M_p + lVar6 * 4) <=
                   *(int *)((long)(&local_6658.m_access.m_size + -6) + lVar6 * 4);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
            if (local_6828[0] != (string)0x0) {
              uVar7 = 0xffffffffffffffff;
              do {
                if (uVar7 == 2) {
                  uVar9 = 3;
                  break;
                }
                uVar9 = uVar7 + 1;
                lVar6 = uVar7 + 2;
                uVar7 = uVar9;
              } while (local_6828[lVar6] != '\0');
              if (2 < uVar9) goto LAB_00fd6715;
            }
            if ((0x7e < (int)(local_6878._0_4_ + DS)) || (local_6920->m_numSamples < 2)) {
              iVar3 = 1;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_67f8,
                         (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_FAIL,iVar10,iVar11,0)
              ;
            }
          }
LAB_00fd6715:
          iVar10 = iVar10 + 1;
        } while (iVar10 != (int)local_66e8.m_name._M_string_length);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != local_6894);
  }
  __fd = log.order;
  if (iVar3 != 0) {
    local_65a0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_6598);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_6598,"Faulty pixel(s) found.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_65a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_6598);
    std::ios_base::~ios_base(local_6528);
    if (iVar3 != 0) {
      local_6878._0_8_ = (long)local_6878 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6878,"Images","");
      local_6828._0_8_ = (long)local_6828 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6828,"Image comparison","");
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&local_6658,(string *)local_6878,(string *)local_6828);
      tcu::TestLog::startImageSet
                ((TestLog *)log,local_6658.m_name._M_dataplus._M_p,
                 local_6658.m_description._M_dataplus._M_p);
      local_68b8._M_dataplus._M_p = (pointer)&local_68b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68b8,"TestImage","");
      local_68d8._M_dataplus._M_p = (pointer)&local_68d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68d8,"Test image","");
      local_67f8.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar14 = (void *)local_6958.m_pixels.m_cap;
      if ((void *)local_6958.m_pixels.m_cap != (void *)0x0) {
        pvVar14 = local_6958.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_6728,(TextureFormat *)&local_67f8,local_6958.m_width,
                 local_6958.m_height,1,pvVar14);
      access = &local_6728;
      tcu::LogImage::LogImage
                (&local_66e8,&local_68b8,&local_68d8,(ConstPixelBufferAccess *)access,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_66e8,__fd,__buf,(size_t)access);
      local_68f8._M_dataplus._M_p = (pointer)&local_68f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68f8,"InvalidPixels","");
      local_6918._M_dataplus._M_p = (pointer)&local_6918.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6918,"Invalid pixels","");
      local_6848._M_dataplus._M_p = (pointer)0x300000008;
      uVar13 = local_6940.field_2._M_allocated_capacity;
      if ((void *)local_6940.field_2._M_allocated_capacity != (void *)0x0) {
        uVar13 = local_6940._M_string_length;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_65c8,(TextureFormat *)&local_6848,
                 (int)local_6940._M_dataplus._M_p,local_6940._M_dataplus._M_p._4_4_,1,(void *)uVar13
                );
      pCVar8 = &local_65c8;
      tcu::LogImage::LogImage
                (&local_67f8,&local_68f8,&local_6918,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_67f8,__fd,__buf_00,(size_t)pCVar8);
      tcu::TestLog::endImageSet((TestLog *)log);
      local_65a0 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_6598);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_6598,"Got overdraw.",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_65a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_6598);
      std::ios_base::~ios_base(local_6528);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_67f8.m_description._M_dataplus._M_p != &local_67f8.m_description.field_2) {
        operator_delete(local_67f8.m_description._M_dataplus._M_p,
                        local_67f8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_67f8.m_name._M_dataplus._M_p != &local_67f8.m_name.field_2) {
        operator_delete(local_67f8.m_name._M_dataplus._M_p,
                        local_67f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6918._M_dataplus._M_p != &local_6918.field_2) {
        operator_delete(local_6918._M_dataplus._M_p,local_6918.field_2._M_allocated_capacity + 1);
      }
      pFVar2 = local_6850;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68f8._M_dataplus._M_p != &local_68f8.field_2) {
        operator_delete(local_68f8._M_dataplus._M_p,local_68f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_66e8.m_description._M_dataplus._M_p != &local_66e8.m_description.field_2) {
        operator_delete(local_66e8.m_description._M_dataplus._M_p,
                        local_66e8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_66e8.m_name._M_dataplus._M_p != &local_66e8.m_name.field_2) {
        operator_delete(local_66e8.m_name._M_dataplus._M_p,
                        local_66e8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68d8._M_dataplus._M_p != &local_68d8.field_2) {
        operator_delete(local_68d8._M_dataplus._M_p,local_68d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68b8._M_dataplus._M_p != &local_68b8.field_2) {
        operator_delete(local_68b8._M_dataplus._M_p,local_68b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6658.m_description._M_dataplus._M_p != &local_6658.m_description.field_2) {
        operator_delete(local_6658.m_description._M_dataplus._M_p,
                        local_6658.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6658.m_name._M_dataplus._M_p != &local_6658.m_name.field_2) {
        operator_delete(local_6658.m_name._M_dataplus._M_p,
                        local_6658.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_6828._0_8_ != (long)local_6828 + 0x10) {
        operator_delete((void *)local_6828._0_8_,local_6828._16_8_ + 1);
      }
      if (local_6878._0_8_ != (long)local_6878 + 0x10) {
        operator_delete((void *)local_6878._0_8_,local_6878._16_8_ + 1);
      }
      tcu::TestContext::setTestResult
                ((pFVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Got overdraw");
    }
  }
  tcu::Surface::~Surface((Surface *)&local_6940);
  tcu::Surface::Surface(&local_6890,200,200);
  local_65a0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_6598);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_6598,"Comparing images... ",0x14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_65a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_6598);
  std::ios_base::~ios_base(local_6528);
  local_65a0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_6598);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_6598,"Deviation within radius of ",0x1b);
  std::ostream::operator<<((ostringstream *)&uStack_6598,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_6598," is allowed.",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_65a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_6598);
  std::ios_base::~ios_base(local_6528);
  local_66e8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar14 = (void *)local_6970.m_pixels.m_cap;
  if ((void *)local_6970.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_6970.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_65a0,(TextureFormat *)&local_66e8,local_6970.m_width,
             local_6970.m_height,1,pvVar14);
  local_67f8.m_name._M_dataplus._M_p = (char *)0x300000008;
  pvVar14 = (void *)local_6970.m_pixels.m_cap;
  if ((void *)local_6970.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_6970.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_66e8,(TextureFormat *)&local_67f8,local_6970.m_width,
             local_6970.m_height,1,pvVar14);
  local_6920 = (RenderTarget *)CONCAT44(local_6920._4_4_,uStack_6598._4_4_);
  if (0 < uStack_6598._4_4_) {
    iVar3 = (int)uStack_6598;
    iVar11 = 0;
    do {
      if (0 < iVar3) {
        iVar10 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&local_67f8,(int)local_65a0,iVar10,iVar11);
          local_6658.m_name._M_dataplus._M_p = local_67f8.m_name._M_dataplus._M_p;
          local_6658.m_name._M_string_length =
               CONCAT44(0xff,(undefined4)local_67f8.m_name._M_string_length);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_66e8,(IVec4 *)&local_6658,iVar10,iVar11,0);
          iVar10 = iVar10 + 1;
        } while (iVar3 != iVar10);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != (int)local_6920);
  }
  local_66e8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar14 = (void *)local_6958.m_pixels.m_cap;
  if ((void *)local_6958.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_6958.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_65a0,(TextureFormat *)&local_66e8,local_6958.m_width,
             local_6958.m_height,1,pvVar14);
  local_67f8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar14 = (void *)local_6970.m_pixels.m_cap;
  if ((void *)local_6970.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_6970.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_66e8,(TextureFormat *)&local_67f8,local_6970.m_width,
             local_6970.m_height,1,pvVar14);
  local_6658.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar14 = (void *)local_6890.m_pixels.m_cap;
  if ((void *)local_6890.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_6890.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_67f8,(TextureFormat *)&local_6658,local_6890.m_width,
             local_6890.m_height,1,pvVar14);
  iVar3 = compareImages((TestLog *)log,(ConstPixelBufferAccess *)local_65a0,
                        (ConstPixelBufferAccess *)&local_66e8,(PixelBufferAccess *)&local_67f8,1,
                        compareBlackNonBlackPixels);
  if (0 < iVar3) {
    local_68b8._M_dataplus._M_p = (pointer)&local_68b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68b8,"Images","");
    local_68d8._M_dataplus._M_p = (pointer)&local_68d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68d8,"Image comparison","");
    tcu::LogImageSet::LogImageSet(&local_6728,&local_68b8,&local_68d8);
    tcu::TestLog::startImageSet
              ((TestLog *)log,local_6728.m_name._M_dataplus._M_p,
               local_6728.m_description._M_dataplus._M_p);
    local_68f8._M_dataplus._M_p = (pointer)&local_68f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68f8,"TestImage","");
    local_6918._M_dataplus._M_p = (pointer)&local_6918.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6918,"Test image","");
    local_67f8.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6958.m_pixels.m_cap != (void *)0x0) {
      local_6958.m_pixels.m_cap = (size_t)local_6958.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_65c8,(TextureFormat *)&local_67f8,local_6958.m_width,
               local_6958.m_height,1,(void *)local_6958.m_pixels.m_cap);
    pCVar8 = &local_65c8;
    tcu::LogImage::LogImage
              (&local_66e8,&local_68f8,&local_6918,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_66e8,__fd,__buf_01,(size_t)pCVar8);
    local_6940._M_dataplus._M_p = (pointer)&local_6940.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6940,"ReferenceImage","");
    local_6848._M_dataplus._M_p = (pointer)&local_6848.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6848,"Reference image","");
    local_6658.m_name._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_6970.m_pixels.m_cap != (void *)0x0) {
      local_6970.m_pixels.m_cap = (size_t)local_6970.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_6878,(TextureFormat *)&local_6658,local_6970.m_width,
               local_6970.m_height,1,(void *)local_6970.m_pixels.m_cap);
    pCVar8 = (ConstPixelBufferAccess *)local_6878;
    tcu::LogImage::LogImage
              (&local_67f8,&local_6940,&local_6848,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_67f8,__fd,__buf_02,(size_t)pCVar8);
    local_6748._M_dataplus._M_p = (pointer)&local_6748.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6748,"DifferenceMask","");
    local_6768._M_dataplus._M_p = (pointer)&local_6768.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6768,"Difference mask","");
    local_6800.order = RGBA;
    local_6800.type = UNORM_INT8;
    if ((void *)local_6890.m_pixels.m_cap != (void *)0x0) {
      local_6890.m_pixels.m_cap = (size_t)local_6890.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_6828,&local_6800,local_6890.m_width,local_6890.m_height,1,
               (void *)local_6890.m_pixels.m_cap);
    pCVar8 = (ConstPixelBufferAccess *)local_6828;
    tcu::LogImage::LogImage
              (&local_6658,&local_6748,&local_6768,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6658,__fd,__buf_03,(size_t)pCVar8);
    tcu::TestLog::endImageSet((TestLog *)log);
    local_65a0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_6598);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_6598,"Got ",4);
    std::ostream::operator<<((ostringstream *)&uStack_6598,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_6598," faulty pixel(s).",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_65a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_6598);
    std::ios_base::~ios_base(local_6528);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6658.m_description._M_dataplus._M_p != &local_6658.m_description.field_2) {
      operator_delete(local_6658.m_description._M_dataplus._M_p,
                      local_6658.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6658.m_name._M_dataplus._M_p != &local_6658.m_name.field_2) {
      operator_delete(local_6658.m_name._M_dataplus._M_p,
                      local_6658.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6768._M_dataplus._M_p != &local_6768.field_2) {
      operator_delete(local_6768._M_dataplus._M_p,local_6768.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6748._M_dataplus._M_p != &local_6748.field_2) {
      operator_delete(local_6748._M_dataplus._M_p,local_6748.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_67f8.m_description._M_dataplus._M_p != &local_67f8.m_description.field_2) {
      operator_delete(local_67f8.m_description._M_dataplus._M_p,
                      local_67f8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_67f8.m_name._M_dataplus._M_p != &local_67f8.m_name.field_2) {
      operator_delete(local_67f8.m_name._M_dataplus._M_p,
                      local_67f8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6848._M_dataplus._M_p != &local_6848.field_2) {
      operator_delete(local_6848._M_dataplus._M_p,local_6848.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6940._M_dataplus._M_p != &local_6940.field_2) {
      operator_delete(local_6940._M_dataplus._M_p,local_6940.field_2._M_allocated_capacity + 1);
    }
    pFVar2 = local_6850;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_66e8.m_description._M_dataplus._M_p != &local_66e8.m_description.field_2) {
      operator_delete(local_66e8.m_description._M_dataplus._M_p,
                      local_66e8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_66e8.m_name._M_dataplus._M_p != &local_66e8.m_name.field_2) {
      operator_delete(local_66e8.m_name._M_dataplus._M_p,
                      local_66e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6918._M_dataplus._M_p != &local_6918.field_2) {
      operator_delete(local_6918._M_dataplus._M_p,local_6918.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68f8._M_dataplus._M_p != &local_68f8.field_2) {
      operator_delete(local_68f8._M_dataplus._M_p,local_68f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6728.m_description._M_dataplus._M_p != &local_6728.m_description.field_2) {
      operator_delete(local_6728.m_description._M_dataplus._M_p,
                      local_6728.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6728.m_name._M_dataplus._M_p != &local_6728.m_name.field_2) {
      operator_delete(local_6728.m_name._M_dataplus._M_p,
                      local_6728.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68d8._M_dataplus._M_p != &local_68d8.field_2) {
      operator_delete(local_68d8._M_dataplus._M_p,local_68d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68b8._M_dataplus._M_p != &local_68b8.field_2) {
      operator_delete(local_68b8._M_dataplus._M_p,local_68b8.field_2._M_allocated_capacity + 1);
    }
    tcu::TestContext::setTestResult
              ((pFVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&local_6890);
  tcu::Surface::~Surface(&local_6970);
  tcu::Surface::~Surface(&local_6958);
  sglr::ReferenceContext::~ReferenceContext(&local_61e0);
  tcu::TextureLevel::~TextureLevel(&local_63c8.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_63c8.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_63c8.m_colorbuffer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6420.extensionStr._M_dataplus._M_p != &local_6420.extensionStr.field_2) {
    operator_delete(local_6420.extensionStr._M_dataplus._M_p,
                    CONCAT71(local_6420.extensionStr.field_2._M_allocated_capacity._1_7_,
                             local_6420.extensionStr.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6420.extensionList);
  sglr::GLContext::~GLContext(&local_6350);
  return;
}

Assistant:

void FillTest::testRender (void)
{
	using tcu::TestLog;

	const int						numSamples	= 1;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(glesContext);
	glesContext.readPixels(testSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(refContext);
	refContext.readPixels(refSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// check overdraw
	{
		bool				overdrawOk;
		tcu::Surface		outputImage(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

		log << TestLog::Message << "Checking for overdraw " << TestLog::EndMessage;
		overdrawOk = checkHalfFilledImageOverdraw(log, m_context.getRenderTarget(), testSurface.getAccess(), outputImage.getAccess());

		if (!overdrawOk)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("InvalidPixels", "Invalid pixels", outputImage.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got overdraw." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got overdraw");
		}
	}

	// compare & check missing pixels
	{
		const int			kernelRadius	= 1;
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		blitImageOnBlackSurface(refSurface.getAccess(), refSurface.getAccess()); // makes images look right in Candy

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}